

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_madd_us8(c_v64 a,c_v64 b)

{
  c_v64 cVar1;
  int local_3c;
  undefined2 local_38;
  int local_34;
  undefined2 local_30;
  int local_2c;
  undefined2 local_28;
  int local_24;
  undefined2 local_20;
  int32_t u;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local.u8[0] = a.u8[0];
  b_local.u8[0] = b.u8[0];
  a_local.u8[1] = a.u8[1];
  b_local.u8[1] = b.u8[1];
  local_24 = (uint)a_local.u8[0] * (int)b_local.s8[0] + (uint)a_local.u8[1] * (int)b_local.s8[1];
  if (local_24 < 0x8000) {
    if (local_24 < -0x8000) {
      local_24 = -0x8000;
    }
    local_20 = (undefined2)local_24;
  }
  else {
    local_20 = 0x7fff;
  }
  a_local.u8[2] = a.u8[2];
  b_local.u8[2] = b.u8[2];
  a_local.u8[3] = a.u8[3];
  b_local.u8[3] = b.u8[3];
  local_2c = (uint)a_local.u8[2] * (int)b_local.s8[2] + (uint)a_local.u8[3] * (int)b_local.s8[3];
  if (local_2c < 0x8000) {
    if (local_2c < -0x8000) {
      local_2c = -0x8000;
    }
    local_28 = (undefined2)local_2c;
  }
  else {
    local_28 = 0x7fff;
  }
  a_local.u8[4] = a.u8[4];
  b_local.u8[4] = b.u8[4];
  a_local.u8[5] = a.u8[5];
  b_local.u8[5] = b.u8[5];
  local_34 = (uint)a_local.u8[4] * (int)b_local.s8[4] + (uint)a_local.u8[5] * (int)b_local.s8[5];
  if (local_34 < 0x8000) {
    if (local_34 < -0x8000) {
      local_34 = -0x8000;
    }
    local_30 = (undefined2)local_34;
  }
  else {
    local_30 = 0x7fff;
  }
  a_local.u8[6] = a.u8[6];
  b_local.u8[6] = b.u8[6];
  a_local.u8[7] = a.u8[7];
  b_local.u8[7] = b.u8[7];
  local_3c = (uint)a_local.u8[6] * (int)b_local.s8[6] + (uint)a_local.u8[7] * (int)b_local.s8[7];
  if (local_3c < 0x8000) {
    if (local_3c < -0x8000) {
      local_3c = -0x8000;
    }
    local_38 = (undefined2)local_3c;
  }
  else {
    local_38 = 0x7fff;
  }
  cVar1.u16[1] = local_28;
  cVar1.u16[0] = local_20;
  cVar1.u16[2] = local_30;
  cVar1.u16[3] = local_38;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_madd_us8(c_v64 a, c_v64 b) {
  c_v64 t;
  int32_t u;
  u = a.u8[0] * b.s8[0] + a.u8[1] * b.s8[1];
  t.s16[0] = SIMD_CLAMP(u, -32768, 32767);
  u = a.u8[2] * b.s8[2] + a.u8[3] * b.s8[3];
  t.s16[1] = SIMD_CLAMP(u, -32768, 32767);
  u = a.u8[4] * b.s8[4] + a.u8[5] * b.s8[5];
  t.s16[2] = SIMD_CLAMP(u, -32768, 32767);
  u = a.u8[6] * b.s8[6] + a.u8[7] * b.s8[7];
  t.s16[3] = SIMD_CLAMP(u, -32768, 32767);
  return t;
}